

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void getWTREECoeffs(wtree_object wt,int X,int Y,double *coeffs,int N)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *__format;
  int iVar6;
  
  uVar3 = wt->J;
  if ((X < 1) || ((int)uVar3 < X)) {
    __format = "X co-ordinate must be >= 1 and <= %d";
  }
  else {
    iVar2 = 1;
    iVar6 = X;
    do {
      iVar2 = iVar2 * 2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    if ((-1 < Y) && (Y < iVar2)) {
      iVar2 = 0;
      if (X != 1) {
        iVar6 = 2;
        if (2 < X) {
          iVar6 = X;
        }
        iVar6 = iVar6 + -1;
        iVar2 = 0;
        iVar4 = 1;
        do {
          iVar2 = iVar2 + iVar4 * 2;
          iVar4 = iVar4 * 2;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      if (0 < N) {
        iVar2 = wt->nodelength[iVar2 + Y];
        pdVar1 = wt->output;
        uVar5 = 0;
        do {
          coeffs[uVar5] = pdVar1[(long)iVar2 + uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)N != uVar5);
      }
      return;
    }
    uVar3 = iVar2 - 1;
    __format = "Y co-ordinate must be >= 0 and <= %d";
  }
  printf(__format,(ulong)uVar3);
  exit(-1);
}

Assistant:

void getWTREECoeffs(wtree_object wt, int X,int Y,double *coeffs,int N) {
	int ymax,i,t,t2;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 ||Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	if (X == 1) {
		t = 0;
	}
	else {
		t = 0;
		t2 = 1;
		for (i = 0; i < X - 1; ++i) {
			t2 *= 2;
			t += t2;
		}
	}

	t += Y;
	t2 = wt->nodelength[t];
	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[t2+i];
	}

}